

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerConnection.cxx
# Opt level: O2

void __thiscall cmServerStdIoConnection::cmServerStdIoConnection(cmServerStdIoConnection *this)

{
  cmConnectionBufferStrategy *bufferStrategy;
  
  bufferStrategy = (cmConnectionBufferStrategy *)operator_new(0x28);
  bufferStrategy->_vptr_cmConnectionBufferStrategy =
       (_func_int **)&PTR__cmServerBufferStrategy_00538ae0;
  bufferStrategy[1]._vptr_cmConnectionBufferStrategy = (_func_int **)(bufferStrategy + 3);
  bufferStrategy[2]._vptr_cmConnectionBufferStrategy = (_func_int **)0x0;
  *(undefined1 *)&bufferStrategy[3]._vptr_cmConnectionBufferStrategy = 0;
  cmStdIoConnection::cmStdIoConnection(&this->super_cmStdIoConnection,bufferStrategy);
  (this->super_cmStdIoConnection).super_cmEventBasedConnection.super_cmConnection._vptr_cmConnection
       = (_func_int **)&PTR_WriteData_00538be0;
  return;
}

Assistant:

cmServerStdIoConnection::cmServerStdIoConnection()
  : cmStdIoConnection(new cmServerBufferStrategy)
{
}